

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::object_method>::holder<cs_impl::any_const&,cs_impl::any&,bool>
          (holder<cs::object_method> *this,any *args,any *args_1,bool *args_2)

{
  baseHolder *in_RDI;
  any *in_stack_ffffffffffffffa8;
  undefined1 request_fold;
  var *in_stack_ffffffffffffffc0;
  var *in_stack_ffffffffffffffc8;
  object_method *in_stack_ffffffffffffffd0;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_006bae58;
  request_fold = (undefined1)((ulong)(in_RDI + 1) >> 0x38);
  any((any *)in_RDI,in_stack_ffffffffffffffa8);
  any((any *)in_RDI,in_stack_ffffffffffffffa8);
  cs::object_method::object_method
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (bool)request_fold);
  ~any((any *)0x518f20);
  ~any((any *)0x518f2a);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}